

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEncode
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringEncode *curr)

{
  Literal *pLVar1;
  size_t sVar2;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Literal *pLVar8;
  Literal *this_00;
  uint uVar9;
  undefined1 local_150 [8];
  Flow str;
  Flow array;
  Flow start;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<wasm::GCData> arrayData;
  shared_ptr<wasm::GCData> strData;
  
  pcVar3 = PRINT;
  sVar2 = NONCONSTANT_FLOW;
  if (*(int *)(curr + 0x10) == 1) {
    visit((Flow *)local_150,this,*(Expression **)(curr + 0x18));
    if (str.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&str.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
      if (array.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&array.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x28));
        if (start.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_150);
          wasm::Literal::getGCData();
          Flow::getSingleValue((Flow *)&str.breakTo.super_IString.str._M_str);
          wasm::Literal::getGCData();
          if ((arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             (local_58 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          Flow::getSingleValue((Flow *)&array.breakTo.super_IString.str._M_str);
          uVar5 = wasm::Literal::getUnsigned();
          _Var4 = arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_58;
          lVar6 = (long)arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                  *(long *)&arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._M_use_count;
          uVar7 = lVar6 / 0x18 +
                  *(long *)&(arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count;
          if ((CARRY8(uVar7,uVar5)) ||
             (lVar6 = (long)local_58[3]._vptr__Sp_counted_base - *(long *)&local_58[2]._M_use_count,
             (ulong)(lVar6 / 0x18 + *(long *)&local_58->_M_use_count) < uVar7 + uVar5)) {
            (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar6 % 0x18);
          }
          pLVar1 = (Literal *)
                   (strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi + 1);
          uVar9 = 0;
          while( true ) {
            uVar7 = (ulong)uVar9;
            if ((ulong)(((long)_Var4._M_pi[3]._vptr__Sp_counted_base -
                        *(long *)&_Var4._M_pi[2]._M_use_count) / 0x18 +
                       *(long *)&(_Var4._M_pi)->_M_use_count) <= uVar7) break;
            pLVar8 = (Literal *)(*(long *)&_Var4._M_pi[2]._M_use_count + -0x18 + uVar7 * 0x18);
            if (uVar7 == 0) {
              pLVar8 = (Literal *)(_Var4._M_pi + 1);
            }
            this_00 = (Literal *)
                      (*(long *)&strData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi[2]._M_use_count + -0x18 + (uVar5 + uVar7) * 0x18)
            ;
            if (uVar5 + uVar7 == 0) {
              this_00 = pLVar1;
            }
            wasm::Literal::operator=(this_00,pLVar8);
            uVar9 = uVar9 + 1;
          }
          start.breakTo.super_IString.str._M_str._0_4_ =
               (int)(((long)arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                     *(long *)&arrayData.
                               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi[2]._M_use_count) / 0x18) +
               (arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count;
          Flow::Flow(__return_storage_ptr__,(Literal *)&start.breakTo.super_IString.str._M_str);
          wasm::Literal::~Literal((Literal *)&start.breakTo.super_IString.str._M_str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&arrayData);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&strData);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&array.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&array.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&str.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&str.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_150);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_150);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  func.super_IString.str._M_str = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar2;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar3;
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEncode(StringEncode* curr) {
    // For now we only support JS-style strings into arrays.
    if (curr->op != StringEncodeWTF16Array) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow str = visit(curr->str);
    if (str.breaking()) {
      return str;
    }
    Flow array = visit(curr->array);
    if (array.breaking()) {
      return array;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }

    auto strData = str.getSingleValue().getGCData();
    auto arrayData = array.getSingleValue().getGCData();
    if (!strData || !arrayData) {
      trap("null ref");
    }
    auto startVal = start.getSingleValue().getUnsigned();
    auto& strValues = strData->values;
    auto& arrayValues = arrayData->values;
    size_t end;
    if (std::ckd_add<size_t>(&end, startVal, strValues.size()) ||
        end > arrayValues.size()) {
      trap("oob");
    }

    for (Index i = 0; i < strValues.size(); i++) {
      arrayValues[startVal + i] = strValues[i];
    }

    return Literal(int32_t(strData->values.size()));
  }